

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_gleam.cxx
# Opt level: O1

void frame_rect(int x,int y,int w,int h,Fl_Color fg1,Fl_Color fg2,Fl_Color lc)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  Fl::set_box_color(fg1);
  uVar4 = (h + y) - 1;
  uVar2 = y + 1;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(uint)x,(ulong)uVar4,(ulong)uVar2);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)(uint)(w + x),(ulong)uVar4,(ulong)uVar2);
  uVar3 = x + 1;
  uVar5 = (w + x) - 1;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(uint)y,(ulong)uVar5);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)uVar3,(ulong)(uint)(h + y),(ulong)uVar5);
  Fl::set_box_color(fg2);
  uVar1 = (h + y) - 2;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)uVar3,(ulong)uVar1,(ulong)(y + 2U));
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[9])
            (fl_graphics_driver,(ulong)uVar5,(ulong)uVar1,(ulong)(y + 2U));
  Fl::set_box_color(lc);
  uVar1 = (w + x) - 3;
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)(x + 2U),(ulong)uVar2,(ulong)uVar1);
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[6])
            (fl_graphics_driver,(ulong)(x + 2U),(ulong)uVar4,(ulong)uVar1);
  return;
}

Assistant:

static void frame_rect(int x, int y, int w, int h, Fl_Color fg1, Fl_Color fg2, Fl_Color lc) {
  gleam_color(fg1);
  fl_yxline(x, y+h-1,  y+1);         //Go from bottom to top left side
  fl_yxline(x+w, y+h-1,  y+1);     //Go from bottom to top right side
  fl_xyline(x+1, y, x+w-1);         //Go across the top
  fl_xyline(x+1, y+h, x+w-1);     //Go across the bottom
  gleam_color(fg2);
  fl_yxline(x+1, y+h-2, y+2);     //Go from bottom to top left side
  fl_yxline(x+w-1, y+h-2, y+2); //Go from bottom to top right side
  gleam_color(lc);
  fl_xyline(x+2, y+1, x+w-3);     //Go across the top
  fl_xyline(x+2, y+h-1, x+w-3); //Go across the bottom
}